

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_cursor.hpp
# Opt level: O3

void __thiscall
jsoncons::msgpack::basic_msgpack_cursor<jsoncons::bytes_source,std::allocator<char>>::
basic_msgpack_cursor<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
          (basic_msgpack_cursor<jsoncons::bytes_source,std::allocator<char>> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source,
          msgpack_decode_options *options,allocator<char> *alloc)

{
  char cVar1;
  
  *(undefined8 *)this = 0xb468e0;
  *(undefined8 *)(this + 0x1d8) = 0xb46980;
  basic_msgpack_parser<jsoncons::bytes_source,std::allocator<char>>::
  basic_msgpack_parser<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
            ((basic_msgpack_parser<jsoncons::bytes_source,std::allocator<char>> *)(this + 8),source,
             options,alloc);
  *(undefined ***)(this + 0xa0) = &PTR__basic_json_visitor_00b30320;
  *(undefined2 *)(this + 0xa8) = 3;
  *(undefined4 *)(this + 0xd0) = 0;
  *(undefined8 *)(this + 0xb0) = 0;
  *(undefined8 *)(this + 0xb8) = 0;
  *(undefined8 *)(this + 0xbc) = 0;
  *(undefined8 *)(this + 0xc4) = 0;
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined8 *)(this + 0xe0) = 0;
  *(undefined8 *)(this + 0xe8) = 0;
  *(undefined8 *)(this + 0xf0) = 0;
  *(undefined8 *)(this + 0xf8) = 0;
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::
  basic_item_event_visitor_to_json_visitor
            ((basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *)(this + 0x100)
             ,(basic_json_visitor<char> *)(this + 0xa0),alloc);
  this[0x1d0] = (basic_msgpack_cursor<jsoncons::bytes_source,std::allocator<char>>)0x0;
  this[0x18] = (basic_msgpack_cursor<jsoncons::bytes_source,std::allocator<char>>)0x1;
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 == '\0') {
    (**(code **)(*(long *)this + 0x38))(this);
  }
  return;
}

Assistant:

basic_msgpack_cursor(Sourceable&& source,
        const msgpack_decode_options& options = msgpack_decode_options(),
        const Allocator& alloc = Allocator())
        : parser_(std::forward<Sourceable>(source), options, alloc),
          cursor_handler_adaptor_(cursor_visitor_, alloc)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next();
        }
    }